

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

iterator * __thiscall
linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::end
          (iterator *__return_storage_ptr__,
          IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *this
          )

{
  AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_> local_40;
  
  AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>::AdapterState
            (&local_40,&this->source);
  AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>::AdapterState
            (&__return_storage_ptr__->source,&local_40);
  __return_storage_ptr__->valid = false;
  AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>::~AdapterState(&local_40);
  return __return_storage_ptr__;
}

Assistant:

iterator end() { return iterator(source, false); }